

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

LYD_FORMAT detect_data_format(char *filepath)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  LYD_FORMAT LVar4;
  ulong uVar5;
  ushort **ppuVar6;
  
  uVar5 = strlen(filepath);
  ppuVar6 = __ctype_b_loc();
  bVar1 = *(byte *)((long)*ppuVar6 + (long)filepath[uVar5 - 1] * 2 + 1);
  while ((bVar1 & 0x20) != 0) {
    filepath[uVar5 - 1] = '\0';
    lVar2 = uVar5 - 2;
    uVar5 = uVar5 - 1;
    bVar1 = *(byte *)((long)*ppuVar6 + (long)filepath[lVar2] * 2 + 1);
  }
  if ((uVar5 < 5) || (iVar3 = strcmp(filepath + (uVar5 - 4),".xml"), iVar3 != 0)) {
    if ((uVar5 < 6) || (iVar3 = strcmp(filepath + (uVar5 - 5),".json"), iVar3 != 0)) {
      if ((uVar5 < 5) || (iVar3 = strcmp(filepath + (uVar5 - 4),".lyb"), iVar3 != 0)) {
        LVar4 = LYD_UNKNOWN;
      }
      else {
        LVar4 = LYD_LYB;
      }
    }
    else {
      LVar4 = LYD_JSON;
    }
  }
  else {
    LVar4 = LYD_XML;
  }
  return LVar4;
}

Assistant:

static LYD_FORMAT
detect_data_format(char *filepath)
{
    size_t len;

    /* detect input format according to file suffix */
    len = strlen(filepath);
    for (; isspace(filepath[len - 1]); len--, filepath[len] = '\0'); /* remove trailing whitespaces */
    if (len >= 5 && !strcmp(&filepath[len - 4], ".xml")) {
        return LYD_XML;
    } else if (len >= 6 && !strcmp(&filepath[len - 5], ".json")) {
        return LYD_JSON;
    } else if (len >= 5 && !strcmp(&filepath[len - 4], ".lyb")) {
        return LYD_LYB;
    } else {
        return LYD_UNKNOWN;
    }
}